

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

size_t muduo::detail::convertHex(char *buf,uintptr_t value)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = 0;
  do {
    buf[sVar2] = "0123456789ABCDEF"[(uint)value & 0xf];
    sVar2 = sVar2 + 1;
    bVar1 = 0xf < value;
    value = value >> 4;
  } while (bVar1);
  buf[sVar2] = '\0';
  std::__reverse<char*>(buf,buf + sVar2);
  return sVar2;
}

Assistant:

size_t convertHex(char buf[], uintptr_t value)
{
  uintptr_t i = value;
  char* p = buf;

  do
  {
    int lsd = static_cast<int>(i % 16);
    i /= 16;
    *p++ = digitsHex[lsd];
  } while (i != 0);

  *p = '\0';
  std::reverse(buf, p);

  return p - buf;
}